

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central.cpp
# Opt level: O2

void * __thiscall Central::malloc(Central *this,size_t __size)

{
  int sc;
  key_type sa;
  Span *this_00;
  mapped_type *ppSVar1;
  key_type pbStack_30;
  
  sa = (key_type)mmap((void *)0x0,(long)spanInfo[(this->nonempty).spanClass][2],3,0x21,0,0);
  this_00 = (Span *)operator_new(0x40);
  sc = (this->nonempty).spanClass;
  Span::Span(this_00,sa,spanInfo[sc][2],spanInfo[sc][3],0,sc,spanInfo[sc][1]);
  pbStack_30 = sa;
  ppSVar1 = std::
            map<bool_*,_Span_*,_std::greater<bool_*>,_std::allocator<std::pair<bool_*const,_Span_*>_>_>
            ::operator[]((map<bool_*,_Span_*,_std::greater<bool_*>,_std::allocator<std::pair<bool_*const,_Span_*>_>_>
                          *)__size,&pbStack_30);
  *ppSVar1 = this_00;
  this_00->prev = this_00;
  this_00->next = this_00;
  return this_00;
}

Assistant:

Span *Central::malloc(SpanMap *spanMap) {
    // 获取一个span, 每次获取链表头部的span
    auto span = nonempty.newSpan(spanMap);  // 如果nonempty没有span, 则调用mmap分配

    return span;

    // 让这个 span 分配一个空间, 并且设置自己的状态.
//    void *addr = span->malloc();
//    if (span->allocCount == span->nelems) {  // 已经分配满了
//        nonempty.popFront();      // pop链表头部的span
//        empty.pushFront(span);   // 将span插入到首部
//    }
//    nmalloc++;
//    return addr;
}